

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem.hpp
# Opt level: O2

void write_constraint<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,baryonyx::constraint>
               (basic_format_context<fmt::v7::detail::buffer_appender<char>,_char> *ctx,problem *p,
               constraint *cst,char *separator)

{
  int *in_R8;
  char *local_20;
  
  local_20 = separator;
  if ((cst->label)._M_len != 0) {
    fmt::v7::
    format_to<fmt::v7::detail::buffer_appender<char>,char[5],std::basic_string_view<char,std::char_traits<char>>const&,true>
              ((buffer_appender<char>)
               (ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
               (char (*) [5])"{}: ",&cst->label);
  }
  write_function_element<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,char>,baryonyx::problem,std::vector<baryonyx::function_element,std::allocator<baryonyx::function_element>>>
            (ctx,p,&cst->elements);
  fmt::v7::format_to<fmt::v7::detail::buffer_appender<char>,char[6],char_const*&,int_const&,true>
            ((v7 *)(ctx->out_).super_back_insert_iterator<fmt::v7::detail::buffer<char>_>.container,
             (buffer_appender<char>)0x554df2,(char (*) [6])&local_20,(char **)&cst->value,in_R8);
  return;
}

Assistant:

void
write_constraint(FormatContext& ctx,
                 const Problem& p,
                 const Constraint& cst,
                 const char* separator)
{
    if (!cst.label.empty())
        fmt::format_to(ctx.out(), "{}: ", cst.label);

    write_function_element(ctx, p, cst.elements);

    fmt::format_to(ctx.out(), "{}{}\n", separator, cst.value);
}